

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcmd_od.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names;
  initializer_list<char> short_names;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names_00;
  initializer_list<char> short_names_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names_01;
  initializer_list<char> short_names_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names_02;
  initializer_list<char> short_names_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names_04;
  initializer_list<char> short_names_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  long_names_05;
  initializer_list<char> short_names_04;
  bool bVar1;
  element_type __val;
  element_type *peVar2;
  element_type *peVar3;
  ostream *poVar4;
  basic_command<_2815e3e1_> *command;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *command_00;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>
  *command_01;
  argument_order order;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_21f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_21e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2120;
  error *e;
  element_type local_2050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2030;
  undefined1 local_2010 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> addr;
  undefined1 local_1fd0 [8];
  shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>_>
  connectOpts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1fb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f98;
  element_type local_1f78;
  element_type local_1f58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f38;
  undefined1 local_1f18 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> x;
  undefined1 local_1ed8 [8];
  shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  greetOpts;
  undefined1 local_1ea8 [8];
  type opts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e70;
  allocator local_1e49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e48;
  allocator local_1e21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e20;
  allocator local_1df9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1df8;
  allocator local_1dd1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1dd0;
  allocator local_1da9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1da8;
  undefined1 local_1d82;
  allocator local_1d81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d78;
  iterator local_1d58;
  size_type local_1d50;
  char local_1d41 [9];
  size_type local_1d38;
  allocator local_1d29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d28;
  allocator local_1d01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d00;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  local_1ce0;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>,_std::tuple<>,_std::tuple<>_>
  local_1c98;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::tuple<>_>
  local_1ba8;
  undefined1 local_17f8 [8];
  basic_command<_2815e3e1_> cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c0;
  allocator local_1199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1198;
  undefined1 local_1172;
  allocator local_1171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1168;
  iterator local_1148;
  size_type local_1140;
  char local_1131 [9];
  size_type local_1128;
  allocator local_1119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1118;
  allocator local_10f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f0;
  allocator local_10c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c8;
  undefined1 local_10a2;
  allocator local_10a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1098;
  iterator local_1078;
  size_type local_1070;
  char local_1061 [9];
  size_type local_1058;
  allocator local_1049;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1048;
  allocator local_1021;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1020;
  undefined1 local_ffa;
  allocator local_ff9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ff8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff0;
  iterator local_fd0;
  size_type local_fc8;
  char local_fb9 [9];
  size_type local_fb0;
  allocator local_fa1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa0;
  allocator local_f79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f78;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  local_f58;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>_>,_std::tuple<>,_std::tuple<>_>
  local_f10;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::tuple<>,_std::tuple<>_>
  local_e20;
  undefined1 local_c88 [8];
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>
  connectCmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  allocator local_a19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  allocator local_9f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  undefined1 local_9ca;
  allocator local_9c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c0;
  iterator local_9a0;
  size_type local_998;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_990;
  allocator local_979;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  allocator local_951;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  allocator local_929;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  undefined1 local_902;
  allocator local_901;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  iterator local_8d8;
  size_type local_8d0;
  char local_8c1 [9];
  size_type local_8b8;
  allocator local_8a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  allocator local_881;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  undefined1 local_85a;
  allocator local_859;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  iterator local_830;
  size_type local_828;
  char local_819 [9];
  size_type local_810;
  allocator local_801;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  allocator local_7c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  local_7a8;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>_>,_std::tuple<>,_std::tuple<>_>
  local_760;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::tuple<>,_std::tuple<>_>
  local_670;
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<>_>
  local_4d8;
  undefined1 local_298 [8];
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  greetCmd;
  char **argv_local;
  int argc_local;
  
  greetCmd.m_arguments.
  super__Tuple_impl<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ._M_head_impl.read._M_invoker = (_Invoker_type)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7c8,"subcmd_od greet",&local_7c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_800,"Greeting command",&local_801);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(&local_7a8,&local_7c8,&local_800);
  local_819[0] = '?';
  local_819._1_8_ = local_819;
  local_810 = 1;
  local_85a = 1;
  local_858 = &local_850;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_850,"help",&local_859);
  local_85a = 0;
  local_830 = &local_850;
  local_828 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_880,"",&local_881);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8a8,"display this help and exit",&local_8a9);
  short_names_04._M_len = local_810;
  short_names_04._M_array = (iterator)local_819._1_8_;
  long_names_05._M_len = local_828;
  long_names_05._M_array = local_830;
  nonsugar::
  basic_command<std::__cxx11::string,main::GreetOption,std::tuple<>,std::tuple<>,std::tuple<>>::
  flag<(main::GreetOption)0,void>
            (&local_760,&local_7a8,short_names_04,long_names_05,&local_880,&local_8a8,exclusive);
  local_8c1[0] = 'g';
  local_8c1._1_8_ = local_8c1;
  local_8b8 = 1;
  local_902 = 1;
  local_900 = &local_8f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8f8,"greet",&local_901);
  local_902 = 0;
  local_8d8 = &local_8f8;
  local_8d0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_928,"STRING",&local_929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_950,"greeting message",&local_951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_978,"Hello",&local_979);
  short_names_03._M_len = local_8b8;
  short_names_03._M_array = (iterator)local_8c1._1_8_;
  long_names_04._M_len = local_8d0;
  long_names_04._M_array = local_8d8;
  nonsugar::
  basic_command<std::__cxx11::string,main::GreetOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)0,void>>,std::tuple<>,std::tuple<>>
  ::flag<(main::GreetOption)1,std::__cxx11::string>
            (&local_670,&local_760,short_names_03,long_names_04,&local_928,&local_950,&local_978,
             normal);
  std::initializer_list<char>::initializer_list((initializer_list<char> *)&local_990);
  local_9ca = 1;
  local_9c8 = &local_9c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9c0,"decorate",&local_9c9);
  local_9ca = 0;
  local_9a0 = &local_9c0;
  local_998 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9f0,"",&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a18,"decorate message",&local_a19);
  long_names_03._M_len = local_998;
  long_names_03._M_array = local_9a0;
  nonsugar::
  basic_command<std::__cxx11::string,main::GreetOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)1,std::__cxx11::string>>,std::tuple<>,std::tuple<>>
  ::flag<(main::GreetOption)2,void>
            (&local_4d8,&local_670,(initializer_list<char>)local_990,long_names_03,&local_9f0,
             &local_a18,normal);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a40,"NAME",(allocator *)&connectCmd.field_0x23f);
  nonsugar::
  basic_command<std::__cxx11::string,main::GreetOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)2,void>>,std::tuple<>,std::tuple<>>
  ::argument<(main::GreetOption)3,std::__cxx11::string>
            ((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_298,&local_4d8,&local_a40);
  std::__cxx11::string::~string((string *)&local_a40);
  std::allocator<char>::~allocator((allocator<char> *)&connectCmd.field_0x23f);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_4d8);
  std::__cxx11::string::~string((string *)&local_a18);
  std::allocator<char>::~allocator((allocator<char> *)&local_a19);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  local_2120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_9a0;
  do {
    local_2120 = local_2120 + -1;
    std::__cxx11::string::~string((string *)local_2120);
  } while (local_2120 != &local_9c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_670);
  std::__cxx11::string::~string((string *)&local_978);
  std::allocator<char>::~allocator((allocator<char> *)&local_979);
  std::__cxx11::string::~string((string *)&local_950);
  std::allocator<char>::~allocator((allocator<char> *)&local_951);
  std::__cxx11::string::~string((string *)&local_928);
  std::allocator<char>::~allocator((allocator<char> *)&local_929);
  local_2138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8d8;
  do {
    local_2138 = local_2138 + -1;
    std::__cxx11::string::~string((string *)local_2138);
  } while (local_2138 != &local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_901);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_760);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  local_2150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_830;
  do {
    local_2150 = local_2150 + -1;
    std::__cxx11::string::~string((string *)local_2150);
  } while (local_2150 != &local_850);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_7a8);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator((allocator<char> *)&local_801);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f78,"subcmd_od connect",&local_f79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fa0,"Connect command",&local_fa1);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(&local_f58,&local_f78,&local_fa0);
  local_fb9[0] = '?';
  local_fb9._1_8_ = local_fb9;
  local_fb0 = 1;
  local_ffa = 1;
  local_ff8 = &local_ff0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ff0,"help",&local_ff9);
  local_ffa = 0;
  local_fd0 = &local_ff0;
  local_fc8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1020,"",&local_1021);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1048,"display this help and exit",&local_1049);
  short_names_02._M_len = local_fb0;
  short_names_02._M_array = (iterator)local_fb9._1_8_;
  long_names_02._M_len = local_fc8;
  long_names_02._M_array = local_fd0;
  nonsugar::
  basic_command<std::__cxx11::string,main::ConnectOption,std::tuple<>,std::tuple<>,std::tuple<>>::
  flag<(main::ConnectOption)0,void>
            (&local_f10,&local_f58,short_names_02,long_names_02,&local_1020,&local_1048,exclusive);
  local_1061[0] = 'h';
  local_1061._1_8_ = local_1061;
  local_1058 = 1;
  local_10a2 = 1;
  local_10a0 = &local_1098;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1098,"host",&local_10a1);
  local_10a2 = 0;
  local_1078 = &local_1098;
  local_1070 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10c8,"HOST",&local_10c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_10f0,"host name",&local_10f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1118,"localhost",&local_1119);
  short_names_01._M_len = local_1058;
  short_names_01._M_array = (iterator)local_1061._1_8_;
  long_names_01._M_len = local_1070;
  long_names_01._M_array = local_1078;
  nonsugar::
  basic_command<std::__cxx11::string,main::ConnectOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)0,void>>,std::tuple<>,std::tuple<>>
  ::flag<(main::ConnectOption)1,std::__cxx11::string>
            (&local_e20,&local_f10,short_names_01,long_names_01,&local_10c8,&local_10f0,&local_1118,
             normal);
  local_1131[0] = 'p';
  local_1131._1_8_ = local_1131;
  local_1128 = 1;
  local_1172 = 1;
  local_1170 = &local_1168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1168,"port",&local_1171);
  local_1172 = 0;
  local_1148 = &local_1168;
  local_1140 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1198,"PORT",&local_1199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_11c0,"port number",(allocator *)&cmd.field_0x62f);
  cmd._1576_4_ = 0x1f90;
  short_names_00._M_len = local_1128;
  short_names_00._M_array = (iterator)local_1131._1_8_;
  long_names_00._M_len = local_1140;
  long_names_00._M_array = local_1148;
  nonsugar::
  basic_command<std::__cxx11::string,main::ConnectOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>>,std::tuple<>,std::tuple<>>
  ::flag<(main::ConnectOption)2,int>
            ((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>
              *)local_c88,&local_e20,short_names_00,long_names_00,&local_1198,&local_11c0,
             (int *)&cmd.field_0x628,normal);
  std::__cxx11::string::~string((string *)&local_11c0);
  std::allocator<char>::~allocator((allocator<char> *)&cmd.field_0x62f);
  std::__cxx11::string::~string((string *)&local_1198);
  std::allocator<char>::~allocator((allocator<char> *)&local_1199);
  local_21e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1148;
  do {
    local_21e0 = local_21e0 + -1;
    std::__cxx11::string::~string((string *)local_21e0);
  } while (local_21e0 != &local_1168);
  std::allocator<char>::~allocator((allocator<char> *)&local_1171);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_e20);
  std::__cxx11::string::~string((string *)&local_1118);
  std::allocator<char>::~allocator((allocator<char> *)&local_1119);
  std::__cxx11::string::~string((string *)&local_10f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10f1);
  std::__cxx11::string::~string((string *)&local_10c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10c9);
  local_21f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1078;
  do {
    local_21f8 = local_21f8 + -1;
    std::__cxx11::string::~string((string *)local_21f8);
  } while (local_21f8 != &local_1098);
  std::allocator<char>::~allocator((allocator<char> *)&local_10a1);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_f10);
  std::__cxx11::string::~string((string *)&local_1048);
  std::allocator<char>::~allocator((allocator<char> *)&local_1049);
  std::__cxx11::string::~string((string *)&local_1020);
  std::allocator<char>::~allocator((allocator<char> *)&local_1021);
  local_2210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_fd0;
  do {
    local_2210 = local_2210 + -1;
    std::__cxx11::string::~string((string *)local_2210);
  } while (local_2210 != &local_ff0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_f58);
  std::__cxx11::string::~string((string *)&local_fa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa1);
  std::__cxx11::string::~string((string *)&local_f78);
  std::allocator<char>::~allocator((allocator<char> *)&local_f79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d00,"subcmd_od",&local_1d01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d28,"Test program for sub commands",&local_1d29);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::basic_command(&local_1ce0,&local_1d00,&local_1d28);
  local_1d41[0] = '?';
  local_1d41._1_8_ = local_1d41;
  local_1d38 = 1;
  local_1d82 = 1;
  local_1d80 = &local_1d78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d78,"help",&local_1d81);
  local_1d82 = 0;
  local_1d58 = &local_1d78;
  local_1d50 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1da8,"",&local_1da9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1dd0,"display this help and exit",&local_1dd1);
  short_names._M_len = local_1d38;
  short_names._M_array = (iterator)local_1d41._1_8_;
  long_names._M_len = local_1d50;
  long_names._M_array = local_1d58;
  sVar5 = local_1d50;
  nonsugar::basic_command<std::__cxx11::string,main::Option,std::tuple<>,std::tuple<>,std::tuple<>>
  ::flag<(main::Option)0,void>
            (&local_1c98,&local_1ce0,short_names,long_names,&local_1da8,&local_1dd0,exclusive);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1df8,"greet",&local_1df9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e20,"Greeting command",&local_1e21);
  nonsugar::
  basic_command<std::__cxx11::string,main::Option,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::Option,(main::Option)0,void>>,std::tuple<>,std::tuple<>>
  ::
  subcommand<(main::Option)1,nonsugar::basic_command<std::__cxx11::string,main::GreetOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)2,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>>
            (&local_1ba8,&local_1c98,&local_1df8,&local_1e20,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e48,"connect",&local_1e49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1e70,"Connect command",
             (allocator *)
             ((long)&opts.
                     super_option_pair<Option,_(Option)2,_nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>_>
                     .value.
                     super___shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  nonsugar::
  basic_command<std::__cxx11::string,main::Option,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::Option,(main::Option)0,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,main::Option,(main::Option)1,nonsugar::basic_command<std::__cxx11::string,main::GreetOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)2,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>>>,std::tuple<>>
  ::
  subcommand<(main::Option)2,nonsugar::basic_command<std::__cxx11::string,main::ConnectOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)2,int>>,std::tuple<>,std::tuple<>>>
            ((basic_command<_2815e3e1_> *)local_17f8,&local_1ba8,&local_1e48,&local_1e70,
             (basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>
              *)local_c88);
  std::__cxx11::string::~string((string *)&local_1e70);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&opts.
                     super_option_pair<Option,_(Option)2,_nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>_>
                     .value.
                     super___shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::__cxx11::string::~string((string *)&local_1e48);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e49);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>,_std::tuple<nonsugar::detail::subcommand<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)1,_nonsugar::basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::tuple<>_>
  ::~basic_command(&local_1ba8);
  std::__cxx11::string::~string((string *)&local_1e20);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e21);
  std::__cxx11::string::~string((string *)&local_1df8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1df9);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_(Option)0,_void>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_1c98);
  std::__cxx11::string::~string((string *)&local_1dd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1dd1);
  std::__cxx11::string::~string((string *)&local_1da8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1da9);
  local_2278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d58;
  do {
    local_2278 = local_2278 + -1;
    std::__cxx11::string::~string((string *)local_2278);
    order = (argument_order)sVar5;
  } while (local_2278 != &local_1d78);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d81);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Option,_std::tuple<>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command(&local_1ce0);
  std::__cxx11::string::~string((string *)&local_1d28);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d29);
  std::__cxx11::string::~string((string *)&local_1d00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d01);
  nonsugar::
  parse<char,nonsugar::basic_command<std::__cxx11::string,main::Option,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::Option,(main::Option)0,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,main::Option,(main::Option)1,nonsugar::basic_command<std::__cxx11::string,main::GreetOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)2,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>>,nonsugar::detail::subcommand<std::__cxx11::string,main::Option,(main::Option)2,nonsugar::basic_command<std::__cxx11::string,main::ConnectOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)2,int>>,std::tuple<>,std::tuple<>>>>,std::tuple<>>>
            ((type *)local_1ea8,(nonsugar *)(ulong)(uint)argc,
             (int)greetCmd.m_arguments.
                  super__Tuple_impl<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                  ._M_head_impl.read._M_invoker,(char **)local_17f8,(basic_command<_2815e3e1_> *)0x0
             ,order);
  bVar1 = nonsugar::
          option_map<main::Option,nonsugar::detail::option_pair<main::Option,(main::Option)0,void>,nonsugar::detail::option_pair<main::Option,(main::Option)1,nonsugar::option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>,nonsugar::detail::option_pair<main::Option,(main::Option)2,nonsugar::option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>>>
          ::has<(main::Option)0>
                    ((option_map<main::Option,nonsugar::detail::option_pair<main::Option,(main::Option)0,void>,nonsugar::detail::option_pair<main::Option,(main::Option)1,nonsugar::option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>,nonsugar::detail::option_pair<main::Option,(main::Option)2,nonsugar::option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>>>
                      *)local_1ea8);
  if (bVar1) {
    nonsugar::
    usage<nonsugar::basic_command<std::__cxx11::string,main::Option,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::Option,(main::Option)0,void>>,std::tuple<nonsugar::detail::subcommand<std::__cxx11::string,main::Option,(main::Option)1,nonsugar::basic_command<std::__cxx11::string,main::GreetOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)2,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>>,nonsugar::detail::subcommand<std::__cxx11::string,main::Option,(main::Option)2,nonsugar::basic_command<std::__cxx11::string,main::ConnectOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)2,int>>,std::tuple<>,std::tuple<>>>>,std::tuple<>>>
              ((string_type *)
               &greetOpts.
                super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,(nonsugar *)local_17f8,command);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             (string *)
                             &greetOpts.
                              super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string
              ((string *)
               &greetOpts.
                super___shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    nonsugar::
    option_map<main::Option,nonsugar::detail::option_pair<main::Option,(main::Option)0,void>,nonsugar::detail::option_pair<main::Option,(main::Option)1,nonsugar::option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>,nonsugar::detail::option_pair<main::Option,(main::Option)2,nonsugar::option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>>>
    ::get_shared<(main::Option)1>
              ((option_map<main::Option,nonsugar::detail::option_pair<main::Option,(main::Option)0,void>,nonsugar::detail::option_pair<main::Option,(main::Option)1,nonsugar::option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>,nonsugar::detail::option_pair<main::Option,(main::Option)2,nonsugar::option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>>>
                *)local_1ed8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1ed8);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1ed8);
      bVar1 = nonsugar::
              option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>
              ::has<(main::GreetOption)0>
                        ((option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>
                          *)peVar2);
      if (bVar1) {
        nonsugar::
        usage<nonsugar::basic_command<std::__cxx11::string,main::GreetOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::flag<std::__cxx11::string,main::GreetOption,(main::GreetOption)2,void>>,std::tuple<>,std::tuple<nonsugar::detail::argument<std::__cxx11::string,main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>>
                  ((string_type *)((long)&x.field_2 + 8),(nonsugar *)local_298,command_00);
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)(x.field_2._M_local_buf + 8));
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)(x.field_2._M_local_buf + 8));
      }
      else {
        peVar2 = std::
                 __shared_ptr_access<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_1ed8);
        nonsugar::
        option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>
        ::get<(main::GreetOption)1>
                  (&local_1f58,
                   (option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>
                    *)peVar2);
        std::operator+(&local_1f38,&local_1f58,", ");
        peVar2 = std::
                 __shared_ptr_access<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_1ed8);
        nonsugar::
        option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>
        ::get<(main::GreetOption)3>
                  (&local_1f78,
                   (option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>
                    *)peVar2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f18,&local_1f38,&local_1f78);
        std::__cxx11::string::~string((string *)&local_1f78);
        std::__cxx11::string::~string((string *)&local_1f38);
        std::__cxx11::string::~string((string *)&local_1f58);
        peVar2 = std::
                 __shared_ptr_access<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_1ed8);
        connectOpts.
        super___shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._7_1_ = 0;
        bVar1 = nonsugar::
                option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>
                ::has<(main::GreetOption)2>
                          ((option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>
                            *)peVar2);
        if (bVar1) {
          std::operator+(&local_1fb8,"*** ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f18);
          connectOpts.
          super___shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._7_1_ = 1;
          std::operator+(&local_1f98,&local_1fb8," ***");
        }
        else {
          std::__cxx11::string::string((string *)&local_1f98,(string *)local_1f18);
        }
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_1f98);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_1f98);
        if ((connectOpts.
             super___shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._7_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1fb8);
        }
        std::__cxx11::string::~string((string *)local_1f18);
      }
    }
    else {
      nonsugar::
      option_map<main::Option,nonsugar::detail::option_pair<main::Option,(main::Option)0,void>,nonsugar::detail::option_pair<main::Option,(main::Option)1,nonsugar::option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>,nonsugar::detail::option_pair<main::Option,(main::Option)2,nonsugar::option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>>>
      ::get_shared<(main::Option)2>
                ((option_map<main::Option,nonsugar::detail::option_pair<main::Option,(main::Option)0,void>,nonsugar::detail::option_pair<main::Option,(main::Option)1,nonsugar::option_map<main::GreetOption,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)0,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)2,void>,nonsugar::detail::option_pair<main::GreetOption,(main::GreetOption)3,std::__cxx11::string>>>,nonsugar::detail::option_pair<main::Option,(main::Option)2,nonsugar::option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>>>
                  *)local_1fd0);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1fd0);
      if (bVar1) {
        peVar3 = std::
                 __shared_ptr_access<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_1fd0);
        bVar1 = nonsugar::
                option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>
                ::has<(main::ConnectOption)0>
                          ((option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>
                            *)peVar3);
        if (bVar1) {
          nonsugar::
          usage<nonsugar::basic_command<std::__cxx11::string,main::ConnectOption,std::tuple<nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::flag<std::__cxx11::string,main::ConnectOption,(main::ConnectOption)2,int>>,std::tuple<>,std::tuple<>>>
                    ((string_type *)((long)&addr.field_2 + 8),(nonsugar *)local_c88,command_01);
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)(addr.field_2._M_local_buf + 8));
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)(addr.field_2._M_local_buf + 8));
        }
        else {
          peVar3 = std::
                   __shared_ptr_access<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_1fd0);
          nonsugar::
          option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>
          ::get<(main::ConnectOption)1>
                    (&local_2050,
                     (option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>
                      *)peVar3);
          std::operator+(&local_2030,&local_2050,":");
          peVar3 = std::
                   __shared_ptr_access<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_1fd0);
          __val = nonsugar::
                  option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>
                  ::get<(main::ConnectOption)2>
                            ((option_map<main::ConnectOption,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)0,void>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)1,std::__cxx11::string>,nonsugar::detail::option_pair<main::ConnectOption,(main::ConnectOption)2,int>>
                              *)peVar3);
          std::__cxx11::to_string((string *)&e,__val);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2010,&local_2030,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
          std::__cxx11::string::~string((string *)&e);
          std::__cxx11::string::~string((string *)&local_2030);
          std::__cxx11::string::~string((string *)&local_2050);
          poVar4 = std::operator<<((ostream *)&std::cout,"connect to ");
          poVar4 = std::operator<<(poVar4,(string *)local_2010);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_2010);
        }
      }
      std::
      shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>_>
      ::~shared_ptr((shared_ptr<nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>_>
                     *)local_1fd0);
    }
    std::
    shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~shared_ptr((shared_ptr<nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_1ed8);
  }
  nonsugar::
  option_map<Option,_nonsugar::detail::option_pair<Option,_(Option)0,_void>,_nonsugar::detail::option_pair<Option,_(Option)1,_nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_nonsugar::detail::option_pair<Option,_(Option)2,_nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>_>_>
  ::~option_map((option_map<Option,_nonsugar::detail::option_pair<Option,_(Option)0,_void>,_nonsugar::detail::option_pair<Option,_(Option)1,_nonsugar::option_map<GreetOption,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)2,_void>,_nonsugar::detail::option_pair<GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_nonsugar::detail::option_pair<Option,_(Option)2,_nonsugar::option_map<ConnectOption,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::option_pair<ConnectOption,_(ConnectOption)2,_int>_>_>_>
                 *)local_1ea8);
  nonsugar::basic_command<$2815e3e1$>::~basic_command((basic_command<_2815e3e1_> *)local_17f8);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ConnectOption,_(ConnectOption)2,_int>_>,_std::tuple<>,_std::tuple<>_>
                    *)local_c88);
  nonsugar::
  basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~basic_command((basic_command<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_std::tuple<nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)0,_void>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)1,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_nonsugar::detail::flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)2,_void>_>,_std::tuple<>,_std::tuple<nonsugar::detail::argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GreetOption,_(GreetOption)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_298);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    using namespace nonsugar;

    enum class Option { Help, Greet, Connect };
    enum class GreetOption { Help, Message, Decorate, Name };
    enum class ConnectOption { Help, Host, Port };

    auto const greetCmd = command<GreetOption>("subcmd_od greet", "Greeting command")
        .flag<GreetOption::Help>({'?'}, {"help"}, "", "display this help and exit", flag_type::exclusive)
        .flag<GreetOption::Message, std::string>({'g'}, {"greet"}, "STRING", "greeting message", "Hello")
        .flag<GreetOption::Decorate>({}, {"decorate"}, "", "decorate message")
        .argument<GreetOption::Name, std::string>("NAME")
        ;
    auto const connectCmd = command<ConnectOption>("subcmd_od connect", "Connect command")
        .flag<ConnectOption::Help>({'?'}, {"help"}, "", "display this help and exit", flag_type::exclusive)
        .flag<ConnectOption::Host, std::string>({'h'}, {"host"}, "HOST", "host name", "localhost")
        .flag<ConnectOption::Port, int>({'p'}, {"port"}, "PORT", "port number", 8080)
        ;
    auto const cmd = command<Option>("subcmd_od", "Test program for sub commands")
        .flag<Option::Help>({'?'}, {"help"}, "", "display this help and exit", flag_type::exclusive)
        .subcommand<Option::Greet>("greet", "Greeting command", greetCmd)
        .subcommand<Option::Connect>("connect", "Connect command", connectCmd)
        ;

    try {
        auto const opts = parse(argc, argv, cmd);
        if (opts.has<Option::Help>()) {
            std::cout << usage(cmd) << std::endl;
        } else if (auto const greetOpts = opts.get_shared<Option::Greet>()) {
            if (greetOpts->has<GreetOption::Help>()) {
                std::cout << usage(greetCmd) << std::endl;
            } else {
                auto const x = greetOpts->get<GreetOption::Message>() + ", " + greetOpts->get<GreetOption::Name>();
                std::cout << (greetOpts->has<GreetOption::Decorate>() ? "*** " + x + " ***" : x) << std::endl;
            }
        } else if (auto const connectOpts = opts.get_shared<Option::Connect>()) {
            if (connectOpts->has<ConnectOption::Help>()) {
                std::cout << usage(connectCmd) << std::endl;
            } else {
                auto const addr = connectOpts->get<ConnectOption::Host>() + ":" + std::to_string(connectOpts->get<ConnectOption::Port>());
                std::cout << "connect to " << addr << std::endl;
            }
        }
    } catch (error const &e) {
        std::cerr << e.message() << std::endl;
    }
}